

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch *pCVar1;
  Ch *pCVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar3;
  MemoryStream *extraout_RAX;
  MemoryStream *pMVar4;
  undefined4 uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *extraout_RDX;
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *unaff_RBX;
  SizeType elementCount;
  ulong uVar8;
  ulong unaff_R12;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *unaff_R14;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *s;
  bool bVar9;
  
  pMVar4 = is->is_;
  pbVar7 = (byte *)pMVar4->src_;
  if ((pbVar7 == (byte *)pMVar4->end_) || (*pbVar7 != 0x5b)) {
    ParseArray<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              ();
    pMVar4 = extraout_RAX;
    pbVar6 = extraout_RDX;
LAB_0013d32e:
    bVar9 = false;
LAB_0013d1d8:
    if ((pbVar6 != pbVar7) && (bVar9)) {
      pMVar4->src_ = (Ch *)(pbVar6 + 1);
    }
    if (bVar9) {
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndArray(handler,0);
      if (!bVar9) {
        if (*(int *)(unaff_RBX + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                        ,0x334,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_0013d33b:
        pMVar4 = unaff_R14->is_;
        uVar5 = 0x10;
LAB_0013d343:
        pCVar1 = pMVar4->src_;
        pCVar2 = pMVar4->begin_;
        *(undefined4 *)(unaff_RBX + 0x30) = uVar5;
        *(long *)(unaff_RBX + 0x38) = (long)pCVar1 - (long)pCVar2;
      }
    }
    else {
      ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (unaff_RBX,unaff_R14,handler);
      if (*(int *)(unaff_RBX + 0x30) == 0) {
        elementCount = 0;
LAB_0013d21e:
        pMVar4 = unaff_R14->is_;
        pbVar7 = (byte *)pMVar4->src_;
        pbVar6 = (byte *)pMVar4->end_;
        do {
          if (pbVar7 == pbVar6) {
            uVar8 = 0;
          }
          else {
            uVar8 = (ulong)*pbVar7;
          }
          do {
            if ((0x20 < (byte)uVar8) || ((unaff_R12 >> (uVar8 & 0x3f) & 1) == 0)) {
              pbVar7 = (byte *)pMVar4->src_;
              if (pbVar7 == pbVar6) {
                bVar9 = false;
              }
              else {
                bVar9 = *pbVar7 == 0x2c;
                if (bVar9) {
                  pMVar4->src_ = (Ch *)(pbVar7 + 1);
                }
              }
              elementCount = elementCount + 1;
              pbVar7 = (byte *)pMVar4->src_;
              if (bVar9) goto LAB_0013d27c;
              if (pbVar7 == pbVar6) {
                bVar9 = false;
              }
              else {
                bVar9 = *pbVar7 == 0x5d;
                if (bVar9) {
                  pMVar4->src_ = (Ch *)(pbVar7 + 1);
                }
              }
              uVar5 = 7;
              if (!bVar9) goto LAB_0013d343;
              bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      ::EndArray(handler,elementCount);
              if (bVar9) {
                return;
              }
              if (*(int *)(unaff_RBX + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                              ,0x346,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_0013d33b;
            }
            uVar8 = 0;
          } while (pbVar7 == pbVar6);
          pbVar7 = pbVar7 + 1;
          pMVar4->src_ = (Ch *)pbVar7;
        } while( true );
      }
    }
    return;
  }
  if (pbVar7 != (byte *)pMVar4->end_) {
    pMVar4->src_ = (Ch *)(pbVar7 + 1);
  }
  pGVar3 = internal::Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                     (&handler->stack_,1);
  (pGVar3->data_).n = (Number)0x0;
  (pGVar3->data_).s.str = (Ch *)0x0;
  (pGVar3->data_).f.flags = 4;
  pMVar4 = is->is_;
  pbVar6 = (byte *)pMVar4->src_;
  pbVar7 = (byte *)pMVar4->end_;
  unaff_R12 = 0x100002600;
  do {
    if (pbVar6 == pbVar7) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)*pbVar6;
    }
    do {
      if ((0x20 < (byte)uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) {
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar6 = (byte *)pMVar4->src_;
        unaff_RBX = this;
        unaff_R14 = is;
        if (pbVar6 == pbVar7) goto LAB_0013d32e;
        bVar9 = *pbVar6 == 0x5d;
        goto LAB_0013d1d8;
      }
      uVar8 = 0;
    } while (pbVar6 == pbVar7);
    pbVar6 = pbVar6 + 1;
    pMVar4->src_ = (Ch *)pbVar6;
  } while( true );
LAB_0013d27c:
  if (pbVar7 == pbVar6) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)*pbVar7;
  }
  do {
    if ((0x20 < (byte)uVar8) || ((unaff_R12 >> (uVar8 & 0x3f) & 1) == 0)) {
      ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (unaff_RBX,unaff_R14,handler);
      if (*(int *)(unaff_RBX + 0x30) != 0) {
        return;
      }
      goto LAB_0013d21e;
    }
    uVar8 = 0;
  } while (pbVar7 == pbVar6);
  pbVar7 = pbVar7 + 1;
  pMVar4->src_ = (Ch *)pbVar7;
  goto LAB_0013d27c;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '[');
        is.Take();  // Skip '['

        if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, ']')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType elementCount = 0;;) {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++elementCount;
            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (Consume(is, ',')) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            }
            else if (Consume(is, ']')) {
                if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                    RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                return;
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == ']') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }